

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall
MIDIStreamer::CreateSMF(MIDIStreamer *this,TArray<unsigned_char,_unsigned_char> *file,int looplimit)

{
  BYTE *pBVar1;
  MIDIStreamer *pMVar2;
  int iVar3;
  uint uVar4;
  DWORD DVar5;
  undefined4 extraout_var;
  uint uVar6;
  long lVar7;
  DWORD DVar8;
  DWORD *__src;
  uchar *__dest;
  DWORD *event;
  DWORD (*paDVar9) [384];
  DWORD DVar10;
  BYTE status;
  byte local_55;
  byte local_54;
  uchar local_53 [3];
  uchar local_50;
  uchar local_4f [7];
  DWORD (*local_48) [384];
  DWORD (*local_40) [384];
  MIDIStreamer *local_38;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,1);
  iVar3 = 0x1e;
  if (0 < looplimit) {
    iVar3 = looplimit;
  }
  this->LoopLimit = iVar3;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  this->Tempo = this->InitialTempo;
  TArray<unsigned_char,_unsigned_char>::Reserve(file,0x1d);
  pBVar1 = file->Array;
  builtin_memcpy(pBVar1,"MThd",5);
  pBVar1[5] = '\0';
  pBVar1[6] = '\0';
  pBVar1[7] = '\x06';
  pBVar1[8] = '\0';
  pBVar1[9] = '\0';
  pBVar1[10] = '\0';
  pBVar1[0xb] = '\x01';
  pBVar1[0xc] = '\0';
  pBVar1[0xd] = '\0';
  pBVar1[0xe] = 'M';
  pBVar1[0xf] = 'T';
  pBVar1[0xd] = '\0';
  pBVar1[0xe] = 'M';
  pBVar1[0xf] = 'T';
  pBVar1[0x10] = 'r';
  pBVar1[0x11] = 'k';
  pBVar1[0x12] = '\0';
  pBVar1[0x13] = '\0';
  pBVar1[0x14] = '\0';
  pBVar1[0x15] = '\0';
  pBVar1[0x16] = '\0';
  pBVar1[0x17] = 0xff;
  pBVar1[0x18] = 'Q';
  pBVar1[0x19] = '\x03';
  pBVar1[0x1a] = '\0';
  pBVar1[0x1b] = '\0';
  pBVar1[0x1c] = '\0';
  file->Array[0xc] = *(uchar *)((long)&this->Division + 1);
  file->Array[0xd] = (uchar)this->Division;
  file->Array[0x1a] = *(uchar *)((long)&this->InitialTempo + 2);
  file->Array[0x1b] = *(uchar *)((long)&this->InitialTempo + 1);
  file->Array[0x1c] = (uchar)this->InitialTempo;
  local_40 = this->Events;
  local_48 = this->Events + 1;
  DVar10 = 0;
  DVar8 = 0xff;
  local_38 = this;
  do {
    pMVar2 = local_38;
    iVar3 = (*(local_38->super_MusInfo)._vptr_MusInfo[0x19])(local_38);
    paDVar9 = local_40;
    if ((char)iVar3 != '\0') {
      WriteVarLen(file,DVar10);
      local_4f[6] = 0xff;
      TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 6);
      local_4f[5] = 0x2f;
      TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 5);
      local_4f[4] = 0;
      TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 4);
      iVar3 = file->Count - 0x16;
      file->Array[0x12] = (uchar)((uint)iVar3 >> 0x18);
      file->Array[0x13] = (uchar)((uint)iVar3 >> 0x10);
      file->Array[0x14] = (uchar)((uint)iVar3 >> 8);
      file->Array[0x15] = (uchar)iVar3;
      pMVar2->LoopLimit = 0;
      return;
    }
    iVar3 = (*(pMVar2->super_MusInfo)._vptr_MusInfo[0x1c])(pMVar2,local_40,local_48,600000000);
    for (; paDVar9 < (undefined1 *)CONCAT44(extraout_var,iVar3);
        paDVar9 = (DWORD (*) [384])((long)*paDVar9 + lVar7)) {
      DVar10 = DVar10 + (*paDVar9)[0];
      uVar6 = (*paDVar9)[2] >> 0x18;
      if (uVar6 == 0x80) {
        WriteVarLen(file,DVar10);
        uVar6 = (*paDVar9)[2] & 0xffffff;
        if ((char)(*paDVar9)[3] == -0x10) {
          uVar6 = uVar6 - 1;
          local_53[1] = 0xf0;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_53 + 1);
          WriteVarLen(file,uVar6);
          uVar4 = TArray<unsigned_char,_unsigned_char>::Reserve(file,uVar6);
          __dest = file->Array + uVar4;
          __src = (DWORD *)((long)*paDVar9 + 0xd);
        }
        else {
          __src = *paDVar9 + 3;
          local_53[0] = 0xf7;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_53);
          WriteVarLen(file,uVar6);
          uVar4 = TArray<unsigned_char,_unsigned_char>::Reserve(file,uVar6);
          __dest = file->Array + uVar4;
        }
        memcpy(__dest,__src,(ulong)uVar6);
LAB_0035c1e1:
        DVar10 = 0;
        DVar8 = 0xff;
      }
      else {
        if (uVar6 == 1) {
          WriteVarLen(file,DVar10);
          DVar8 = (*paDVar9)[2];
          local_4f[3] = 0xff;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 3);
          local_4f[2] = 0x51;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 2);
          local_4f[1] = 3;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_4f + 1);
          local_4f[0] = (uchar)(DVar8 >> 0x10);
          TArray<unsigned_char,_unsigned_char>::Push(file,local_4f);
          local_50 = (uchar)(DVar8 >> 8);
          TArray<unsigned_char,_unsigned_char>::Push(file,&local_50);
          local_53[2] = (uchar)DVar8;
          TArray<unsigned_char,_unsigned_char>::Push(file,local_53 + 2);
          goto LAB_0035c1e1;
        }
        if ((*paDVar9)[2] < 0x1000000) {
          WriteVarLen(file,DVar10);
          DVar10 = (*paDVar9)[2];
          status = (BYTE)DVar10;
          DVar5 = DVar10;
          if ((BYTE)DVar8 != status) {
            TArray<unsigned_char,_unsigned_char>::Push(file,&status);
            DVar5 = (*paDVar9)[2];
            DVar8 = DVar10;
          }
          local_54 = (byte)(DVar5 >> 8) & 0x7f;
          TArray<unsigned_char,_unsigned_char>::Push(file,&local_54);
          if (MIDI_EventLengths[status >> 4 & 7] == '\x02') {
            local_55 = *(byte *)((long)*paDVar9 + 10) & 0x7f;
            TArray<unsigned_char,_unsigned_char>::Push(file,&local_55);
          }
          DVar10 = 0;
        }
      }
      lVar7 = (ulong)(((*paDVar9)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
      if (-1 < (int)(*paDVar9)[2]) {
        lVar7 = 0xc;
      }
    }
  } while( true );
}

Assistant:

void MIDIStreamer::CreateSMF(TArray<BYTE> &file, int looplimit)
{
	DWORD delay = 0;
	BYTE running_status = 255;

	// Always create songs aimed at GM devices.
	CheckCaps(MOD_MIDIPORT);
	LoopLimit = looplimit <= 0 ? EXPORT_LOOP_LIMIT : looplimit;
	DoRestart();
	Tempo = InitialTempo;

	file.Reserve(sizeof(StaticMIDIhead));
	memcpy(&file[0], StaticMIDIhead, sizeof(StaticMIDIhead));
	file[12] = Division >> 8;
	file[13] = Division & 0xFF;
	file[26] = InitialTempo >> 16;
	file[27] = InitialTempo >> 8;
	file[28] = InitialTempo;

	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			delay += event[0];
			if (MEVT_EVENTTYPE(event[2]) == MEVT_TEMPO)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD tempo = MEVT_EVENTPARM(event[2]);
				file.Push(MIDI_META);
				file.Push(MIDI_META_TEMPO);
				file.Push(3);
				file.Push(BYTE(tempo >> 16));
				file.Push(BYTE(tempo >> 8));
				file.Push(BYTE(tempo));
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == MEVT_LONGMSG)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD len = MEVT_EVENTPARM(event[2]);
				BYTE *bytes = (BYTE *)&event[3];
				if (bytes[0] == MIDI_SYSEX)
				{
					len--;
					file.Push(MIDI_SYSEX);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes + 1, len);
				}
				else
				{
					file.Push(MIDI_SYSEXEND);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes, len);
				}
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				WriteVarLen(file, delay);
				delay = 0;
				BYTE status = BYTE(event[2]);
				if (status != running_status)
				{
					running_status = status;
					file.Push(status);
				}
				file.Push(BYTE((event[2] >> 8) & 0x7F));
				if (MIDI_EventLengths[(status >> 4) & 7] == 2)
				{
					file.Push(BYTE((event[2] >> 16) & 0x7F));
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}

	// End track
	WriteVarLen(file, delay);
	file.Push(MIDI_META);
	file.Push(MIDI_META_EOT);
	file.Push(0);

	// Fill in track length
	DWORD len = file.Size() - 22;
	file[18] = BYTE(len >> 24);
	file[19] = BYTE(len >> 16);
	file[20] = BYTE(len >> 8);
	file[21] = BYTE(len & 255);

	LoopLimit = 0;
}